

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  dfa d;
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [8];
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  dfa *in_stack_ffffffffffffff30;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [55];
  allocator local_61;
  string local_60 [92];
  int local_4;
  
  local_4 = 0;
  dfa::dfa((dfa *)0x11ae8f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,anon_var_dwarf_178a6,&local_61);
  dfa::add_word((dfa *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,anon_var_dwarf_178c9,&local_99);
  dfa::add_word((dfa *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,anon_var_dwarf_178ff + 6,&local_c1);
  dfa::add_word((dfa *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,anon_var_dwarf_178ff + 0xc,&local_e9);
  dfa::add_word((dfa *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,anon_var_dwarf_178ff,&local_111);
  dfa::add_content(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  local_4 = 0;
  dfa::~dfa((dfa *)0x11b05f);
  return local_4;
}

Assistant:

int main()
{
    dfa d;

    // 增加敏感词
    d.add_word("中国人");
    d.add_word("人民");
    d.add_word("人民共产党");
    d.add_word("共产党");

    // 增加待分析文本
    d.add_content("中国人民共产党");

    return 0;
}